

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processConfig.cpp
# Opt level: O3

double stringToDouble(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *words,size_t pos,string *lineID)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  int *piVar6;
  ulong *puVar7;
  ulong uVar8;
  size_type *psVar9;
  char cVar10;
  pointer pbVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  char *end;
  string local_118;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  string local_d8;
  string local_b8;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  string local_78;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar11 = (words->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pos + 1;
  if (uVar1 <= (ulong)((long)(words->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5))
  goto LAB_0010b13f;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Utils::adios_iotest","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"processConfig","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"stringToDouble","");
  std::operator+(&local_50,"Line for ",lineID);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_e8 = *puVar7;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar7;
    local_f8 = (ulong *)*plVar4;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar10 = '\x01';
  if (9 < uVar1) {
    uVar8 = uVar1;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0010afb0;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0010afb0;
      }
      if (uVar8 < 10000) goto LAB_0010afb0;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_0010afb0:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,uVar1);
  uVar1 = CONCAT44(uStack_8c,local_90) + local_f0;
  uVar8 = 0xf;
  if (local_f8 != &local_e8) {
    uVar8 = local_e8;
  }
  if (uVar8 < uVar1) {
    uVar8 = 0xf;
    if (local_98 != local_88) {
      uVar8 = local_88[0];
    }
    if (uVar8 < uVar1) goto LAB_0010b02d;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_0010b02d:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_98);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_118.field_2._M_allocated_capacity = *psVar9;
    local_118.field_2._8_8_ = puVar5[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar9;
    local_118._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_118._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  adios2::helper::Throw<std::invalid_argument>(&local_78,&local_b8,&local_d8,&local_118,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pbVar11 = (words->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
LAB_0010b13f:
  piVar6 = __errno_location();
  *piVar6 = 0;
  local_58 = strtod(pbVar11[pos]._M_dataplus._M_p,(char **)&local_98);
  uVar12 = SUB84(local_58,0);
  uVar13 = (undefined4)((ulong)local_58 >> 0x20);
  if (((char)*local_98 != '\0') || (*piVar6 == 0x22)) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Utils::adios_iotest","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"processConfig","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"stringToDouble","");
    std::operator+(&local_50,"Invalid floating point value given for ",lineID);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_e8 = *puVar7;
      lStack_e0 = plVar4[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar7;
      local_f8 = (ulong *)*plVar4;
    }
    local_f0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,
                                (ulong)(words->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[pos]._M_dataplus.
                                       _M_p);
    psVar9 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_118.field_2._M_allocated_capacity = *psVar9;
      local_118.field_2._8_8_ = plVar4[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar9;
      local_118._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_118._M_string_length = plVar4[1];
    *plVar4 = (long)psVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    adios2::helper::Throw<std::invalid_argument>(&local_78,&local_b8,&local_d8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    uVar12 = SUB84(local_58,0);
    uVar13 = (undefined4)((ulong)local_58 >> 0x20);
  }
  return (double)CONCAT44(uVar13,uVar12);
}

Assistant:

double stringToDouble(std::vector<std::string> &words, size_t pos, std::string lineID)
{
    if (words.size() < pos + 1)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Line for " + lineID + " is invalid. Missing floating point value at word position " +
                std::to_string(pos + 1));
    }

    char *end;
    errno = 0;
    double d = static_cast<double>(std::strtod(words[pos].c_str(), &end));
    if (end[0] || errno == ERANGE)
    {
        adios2::helper::Throw<std::invalid_argument>(
            "Utils::adios_iotest", "processConfig", "stringToDouble",
            "Invalid floating point value given for " + lineID + ": " + words[pos]);
    }
    return d;
}